

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AccelerometerSensor.cpp
# Opt level: O3

void __thiscall iDynTree::AccelerometerSensor::AccelerometerSensor(AccelerometerSensor *this)

{
  AccelerometerPrivateAttributes *pAVar1;
  Transform local_80 [96];
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor =
       (_func_int **)&PTR__AccelerometerSensor_00185970;
  pAVar1 = (AccelerometerPrivateAttributes *)operator_new(0xa8);
  (pAVar1->name)._M_dataplus._M_p = (pointer)&(pAVar1->name).field_2;
  (pAVar1->name)._M_string_length = 0;
  (pAVar1->name).field_2._M_local_buf[0] = '\0';
  iDynTree::Transform::Transform(&pAVar1->link_H_sensor);
  (pAVar1->parent_link_name)._M_dataplus._M_p = (pointer)&(pAVar1->parent_link_name).field_2;
  (pAVar1->parent_link_name)._M_string_length = 0;
  (pAVar1->parent_link_name).field_2._M_local_buf[0] = '\0';
  this->pimpl = pAVar1;
  std::__cxx11::string::_M_replace((ulong)pAVar1,0,(char *)(pAVar1->name)._M_string_length,0x16f785)
  ;
  iDynTree::Transform::Identity();
  iDynTree::Transform::operator=(&this->pimpl->link_H_sensor,local_80);
  pAVar1 = this->pimpl;
  pAVar1->parent_link_index = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&pAVar1->parent_link_name,0,(char *)(pAVar1->parent_link_name)._M_string_length,
             0x16f785);
  return;
}

Assistant:

AccelerometerSensor::AccelerometerSensor()
{
    this->pimpl = new AccelerometerPrivateAttributes;

    this->pimpl->name = "";
    this->pimpl->link_H_sensor = Transform::Identity();
    this->pimpl->parent_link_index = -1;
    this->pimpl->parent_link_name = "";

}